

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

void __thiscall Stopwatch::printStatistics(Stopwatch *this)

{
  pointer pdVar1;
  ostream *poVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  double local_38;
  
  if ((this->lapTimes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->lapTimes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_38 = 0.0;
  }
  else {
    local_38 = 0.0;
    uVar5 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"lap time[",9);
      poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"]: ",3);
      poVar2 = std::ostream::_M_insert<double>
                         ((this->lapTimes).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start[uVar5]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds",8);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      pdVar1 = (this->lapTimes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_38 = local_38 + pdVar1[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)((long)(this->lapTimes).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish - (long)pdVar1 >> 3));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mean lap time: ",0xf);
  lVar3 = (long)(this->lapTimes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->lapTimes).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
  lVar4 = lVar3 >> 3;
  auVar6._8_4_ = (int)(lVar3 >> 0x23);
  auVar6._0_8_ = lVar4;
  auVar6._12_4_ = 0x45300000;
  poVar2 = std::ostream::_M_insert<double>
                     (local_38 /
                      ((auVar6._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0)));
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," seconds",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
  return;
}

Assistant:

void printStatistics() const {
		double sum = 0.0;
		for (size_t i = 0; i < this->lapTimes.size(); ++i) {
			std::cout << "lap time[" << i << "]: "
				<< this->lapTimes[i] << " seconds" << std::endl;
			sum += this->lapTimes[i];
		}
		std::cout << "mean lap time: "
			<< (sum / this->lapTimes.size()) << " seconds" << std::endl;
	}